

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  Geometry *pGVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  long lVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 (*pauVar13) [16];
  int iVar14;
  undefined4 uVar15;
  AABBNodeMB4D *node1;
  ulong uVar16;
  long lVar17;
  RayHitK<8> *pRVar19;
  long lVar20;
  ulong uVar21;
  undefined1 (*pauVar22) [16];
  undefined1 (*pauVar23) [16];
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  Scene *pSVar29;
  ulong uVar30;
  float *vertices;
  ulong uVar31;
  size_t sVar32;
  ulong uVar33;
  size_t sVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  undefined1 auVar94 [32];
  undefined1 auVar95 [64];
  float fVar96;
  float fVar102;
  float fVar103;
  float fVar104;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar109 [16];
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar120 [16];
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar137 [16];
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar149;
  undefined1 auVar145 [16];
  float fVar147;
  float fVar148;
  undefined1 auVar146 [64];
  Scene *scene;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  RayHitK<8> local_28c1;
  ulong local_28c0;
  undefined1 (*local_28b8) [16];
  ulong local_28b0;
  ulong local_28a8;
  undefined1 local_28a0 [16];
  undefined1 local_2890 [16];
  Scene *local_2878;
  undefined1 local_2870 [16];
  undefined1 local_2860 [16];
  undefined1 local_2850 [16];
  undefined1 local_2840 [16];
  undefined1 local_2830 [16];
  undefined1 local_2820 [16];
  undefined1 local_2810 [16];
  ulong local_27f8;
  ulong local_27f0;
  ulong local_27e8;
  ulong local_27e0;
  size_t local_27d8;
  size_t local_27d0;
  RayHitK<8> *local_27c8;
  long local_27c0;
  long local_27b8;
  undefined8 *local_27b0;
  void *local_27a8;
  RTCRayQueryContext *local_27a0;
  RayHitK<8> *local_2798;
  undefined1 (*local_2790) [32];
  undefined4 local_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  float local_2770;
  float fStack_276c;
  float fStack_2768;
  float fStack_2764;
  undefined1 local_2760 [16];
  undefined1 local_2750 [16];
  RayHitK<8> *local_2740;
  undefined1 local_2730 [16];
  undefined1 local_2720 [16];
  undefined1 local_2710 [16];
  undefined1 local_2700 [16];
  undefined1 local_26f0 [16];
  undefined1 local_26e0 [16];
  undefined1 local_26d0 [16];
  undefined1 local_26c0 [32];
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined1 local_2670 [16];
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  undefined1 local_2640 [16];
  undefined1 local_2630 [16];
  undefined1 local_2620 [16];
  undefined8 local_2610;
  undefined8 uStack_2608;
  undefined1 local_2600 [32];
  float local_25e0;
  float fStack_25dc;
  float fStack_25d8;
  float fStack_25d4;
  float fStack_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float fStack_25c4;
  float local_25c0;
  float fStack_25bc;
  float fStack_25b8;
  float fStack_25b4;
  float fStack_25b0;
  float fStack_25ac;
  float fStack_25a8;
  float fStack_25a4;
  float local_25a0;
  float fStack_259c;
  float fStack_2598;
  float fStack_2594;
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  float fStack_2584;
  float local_2580;
  float fStack_257c;
  float fStack_2578;
  float fStack_2574;
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  float fStack_2564;
  float local_2560;
  float fStack_255c;
  float fStack_2558;
  float fStack_2554;
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  float fStack_2544;
  float local_2540;
  float fStack_253c;
  float fStack_2538;
  float fStack_2534;
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  float fStack_2524;
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined4 local_2460;
  undefined4 uStack_245c;
  undefined4 uStack_2458;
  undefined4 uStack_2454;
  undefined4 uStack_2450;
  undefined4 uStack_244c;
  undefined4 uStack_2448;
  undefined4 uStack_2444;
  undefined4 local_2440;
  undefined4 uStack_243c;
  undefined4 uStack_2438;
  undefined4 uStack_2434;
  undefined4 uStack_2430;
  undefined4 uStack_242c;
  undefined4 uStack_2428;
  undefined4 uStack_2424;
  undefined4 local_2420;
  undefined4 uStack_241c;
  undefined4 uStack_2418;
  undefined4 uStack_2414;
  undefined4 uStack_2410;
  undefined4 uStack_240c;
  undefined4 uStack_2408;
  undefined4 uStack_2404;
  uint local_2400;
  uint uStack_23fc;
  uint uStack_23f8;
  uint uStack_23f4;
  uint uStack_23f0;
  uint uStack_23ec;
  uint uStack_23e8;
  uint uStack_23e4;
  uint local_23e0;
  uint uStack_23dc;
  uint uStack_23d8;
  uint uStack_23d4;
  uint uStack_23d0;
  uint uStack_23cc;
  uint uStack_23c8;
  uint uStack_23c4;
  uint local_23c0;
  uint uStack_23bc;
  uint uStack_23b8;
  uint uStack_23b4;
  uint uStack_23b0;
  uint uStack_23ac;
  uint uStack_23a8;
  uint uStack_23a4;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  ulong uVar18;
  
  local_28b8 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar15 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_24e0._4_4_ = uVar15;
  local_24e0._0_4_ = uVar15;
  local_24e0._8_4_ = uVar15;
  local_24e0._12_4_ = uVar15;
  local_24e0._16_4_ = uVar15;
  local_24e0._20_4_ = uVar15;
  local_24e0._24_4_ = uVar15;
  local_24e0._28_4_ = uVar15;
  auVar84 = ZEXT3264(local_24e0);
  uVar15 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2500._4_4_ = uVar15;
  local_2500._0_4_ = uVar15;
  local_2500._8_4_ = uVar15;
  local_2500._12_4_ = uVar15;
  local_2500._16_4_ = uVar15;
  local_2500._20_4_ = uVar15;
  local_2500._24_4_ = uVar15;
  local_2500._28_4_ = uVar15;
  auVar93 = ZEXT3264(local_2500);
  uVar15 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_2520._4_4_ = uVar15;
  local_2520._0_4_ = uVar15;
  local_2520._8_4_ = uVar15;
  local_2520._12_4_ = uVar15;
  local_2520._16_4_ = uVar15;
  local_2520._20_4_ = uVar15;
  local_2520._24_4_ = uVar15;
  local_2520._28_4_ = uVar15;
  auVar95 = ZEXT3264(local_2520);
  local_25a0 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_25c0 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_25e0 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_2540 = local_25a0 * 0.99999964;
  local_2560 = local_25c0 * 0.99999964;
  local_2580 = local_25e0 * 0.99999964;
  local_25a0 = local_25a0 * 1.0000004;
  local_25c0 = local_25c0 * 1.0000004;
  local_25e0 = local_25e0 * 1.0000004;
  local_27e0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_27e8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_27f0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_27f8 = local_27e0 ^ 0x20;
  local_28a8 = local_27e8 ^ 0x20;
  iVar14 = (tray->tnear).field_0.i[k];
  local_26c0._4_4_ = iVar14;
  local_26c0._0_4_ = iVar14;
  local_26c0._8_4_ = iVar14;
  local_26c0._12_4_ = iVar14;
  local_26c0._16_4_ = iVar14;
  local_26c0._20_4_ = iVar14;
  local_26c0._24_4_ = iVar14;
  local_26c0._28_4_ = iVar14;
  auVar146 = ZEXT3264(local_26c0);
  iVar14 = (tray->tfar).field_0.i[k];
  auVar43 = ZEXT3264(CONCAT428(iVar14,CONCAT424(iVar14,CONCAT420(iVar14,CONCAT416(iVar14,CONCAT412(
                                                  iVar14,CONCAT48(iVar14,CONCAT44(iVar14,iVar14)))))
                                               )));
  local_28b0 = local_27f0 ^ 0x20;
  iVar14 = 1 << ((uint)k & 0x1f);
  auVar53._4_4_ = iVar14;
  auVar53._0_4_ = iVar14;
  auVar53._8_4_ = iVar14;
  auVar53._12_4_ = iVar14;
  auVar53._16_4_ = iVar14;
  auVar53._20_4_ = iVar14;
  auVar53._24_4_ = iVar14;
  auVar53._28_4_ = iVar14;
  auVar92 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar53 = vpand_avx2(auVar53,auVar92);
  local_2600 = vpcmpeqd_avx2(auVar53,auVar92);
  fStack_253c = local_2540;
  fStack_2538 = local_2540;
  fStack_2534 = local_2540;
  fStack_2530 = local_2540;
  fStack_252c = local_2540;
  fStack_2528 = local_2540;
  fStack_2524 = local_2540;
  fStack_255c = local_2560;
  fStack_2558 = local_2560;
  fStack_2554 = local_2560;
  fStack_2550 = local_2560;
  fStack_254c = local_2560;
  fStack_2548 = local_2560;
  fStack_2544 = local_2560;
  fStack_257c = local_2580;
  fStack_2578 = local_2580;
  fStack_2574 = local_2580;
  fStack_2570 = local_2580;
  fStack_256c = local_2580;
  fStack_2568 = local_2580;
  fStack_2564 = local_2580;
  fStack_259c = local_25a0;
  fStack_2598 = local_25a0;
  fStack_2594 = local_25a0;
  fStack_2590 = local_25a0;
  fStack_258c = local_25a0;
  fStack_2588 = local_25a0;
  fStack_2584 = local_25a0;
  fStack_25bc = local_25c0;
  fStack_25b8 = local_25c0;
  fStack_25b4 = local_25c0;
  fStack_25b0 = local_25c0;
  fStack_25ac = local_25c0;
  fStack_25a8 = local_25c0;
  fStack_25a4 = local_25c0;
  fStack_25dc = local_25e0;
  fStack_25d8 = local_25e0;
  fStack_25d4 = local_25e0;
  fStack_25d0 = local_25e0;
  fStack_25cc = local_25e0;
  fStack_25c8 = local_25e0;
  fStack_25c4 = local_25e0;
  uVar18 = local_28a8;
  uVar21 = local_28b0;
  uVar25 = local_27e0;
  uVar26 = local_27e8;
  uVar27 = local_27f8;
  sVar34 = k;
  uVar28 = local_27f0;
  fVar96 = local_2540;
  fVar102 = local_2540;
  fVar103 = local_2540;
  fVar104 = local_2540;
  fVar105 = local_2540;
  fVar106 = local_2540;
  fVar107 = local_2540;
  fVar108 = local_2560;
  fVar110 = local_2560;
  fVar111 = local_2560;
  fVar112 = local_2560;
  fVar113 = local_2560;
  fVar114 = local_2560;
  fVar144 = local_2560;
  fVar147 = local_2580;
  fVar148 = local_2580;
  fVar149 = local_2580;
  fVar115 = local_2580;
  fVar116 = local_2580;
  fVar117 = local_2580;
  fVar118 = local_2580;
  fVar119 = local_25a0;
  fVar121 = local_25a0;
  fVar122 = local_25a0;
  fVar123 = local_25a0;
  fVar124 = local_25a0;
  fVar125 = local_25a0;
  fVar126 = local_25a0;
  fVar127 = local_25c0;
  fVar130 = local_25c0;
  fVar131 = local_25c0;
  fVar132 = local_25c0;
  fVar133 = local_25c0;
  fVar134 = local_25c0;
  fVar135 = local_25c0;
  fVar136 = local_25e0;
  fVar138 = local_25e0;
  fVar139 = local_25e0;
  fVar140 = local_25e0;
  fVar141 = local_25e0;
  fVar142 = local_25e0;
  fVar143 = local_25e0;
  local_27d0 = k;
  local_27c8 = ray;
  do {
    do {
      do {
        if (local_28b8 == (undefined1 (*) [16])&local_23a0) {
          return;
        }
        pauVar13 = local_28b8 + -1;
        local_28b8 = local_28b8 + -1;
      } while (*(float *)(ray + sVar34 * 4 + 0x100) < *(float *)(*pauVar13 + 8));
      uVar24 = *(ulong *)*local_28b8;
      do {
        auVar94 = auVar95._0_32_;
        auVar92 = auVar93._0_32_;
        auVar53 = auVar84._0_32_;
        if ((uVar24 & 8) == 0) {
          uVar16 = uVar24 & 0xfffffffffffffff0;
          uVar15 = *(undefined4 *)(ray + sVar34 * 4 + 0xe0);
          auVar54._4_4_ = uVar15;
          auVar54._0_4_ = uVar15;
          auVar54._8_4_ = uVar15;
          auVar54._12_4_ = uVar15;
          auVar54._16_4_ = uVar15;
          auVar54._20_4_ = uVar15;
          auVar54._24_4_ = uVar15;
          auVar54._28_4_ = uVar15;
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar25),auVar54,
                                    *(undefined1 (*) [32])(uVar16 + 0x40 + uVar25));
          auVar55 = vsubps_avx(ZEXT1632(auVar44),auVar53);
          auVar7._4_4_ = fVar102 * auVar55._4_4_;
          auVar7._0_4_ = fVar96 * auVar55._0_4_;
          auVar7._8_4_ = fVar103 * auVar55._8_4_;
          auVar7._12_4_ = fVar104 * auVar55._12_4_;
          auVar7._16_4_ = fVar105 * auVar55._16_4_;
          auVar7._20_4_ = fVar106 * auVar55._20_4_;
          auVar7._24_4_ = fVar107 * auVar55._24_4_;
          auVar7._28_4_ = auVar55._28_4_;
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar26),auVar54,
                                    *(undefined1 (*) [32])(uVar16 + 0x40 + uVar26));
          auVar55 = vmaxps_avx(auVar146._0_32_,auVar7);
          auVar7 = vsubps_avx(ZEXT1632(auVar44),auVar92);
          auVar6._4_4_ = fVar110 * auVar7._4_4_;
          auVar6._0_4_ = fVar108 * auVar7._0_4_;
          auVar6._8_4_ = fVar111 * auVar7._8_4_;
          auVar6._12_4_ = fVar112 * auVar7._12_4_;
          auVar6._16_4_ = fVar113 * auVar7._16_4_;
          auVar6._20_4_ = fVar114 * auVar7._20_4_;
          auVar6._24_4_ = fVar144 * auVar7._24_4_;
          auVar6._28_4_ = auVar7._28_4_;
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar28),auVar54,
                                    *(undefined1 (*) [32])(uVar16 + 0x40 + uVar28));
          auVar7 = vsubps_avx(ZEXT1632(auVar44),auVar94);
          auVar9._4_4_ = fVar148 * auVar7._4_4_;
          auVar9._0_4_ = fVar147 * auVar7._0_4_;
          auVar9._8_4_ = fVar149 * auVar7._8_4_;
          auVar9._12_4_ = fVar115 * auVar7._12_4_;
          auVar9._16_4_ = fVar116 * auVar7._16_4_;
          auVar9._20_4_ = fVar117 * auVar7._20_4_;
          auVar9._24_4_ = fVar118 * auVar7._24_4_;
          auVar9._28_4_ = auVar7._28_4_;
          auVar7 = vmaxps_avx(auVar6,auVar9);
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar27),auVar54,
                                    *(undefined1 (*) [32])(uVar16 + 0x40 + uVar27));
          local_24c0 = vmaxps_avx(auVar55,auVar7);
          auVar55 = vsubps_avx(ZEXT1632(auVar44),auVar53);
          auVar10._4_4_ = fVar121 * auVar55._4_4_;
          auVar10._0_4_ = fVar119 * auVar55._0_4_;
          auVar10._8_4_ = fVar122 * auVar55._8_4_;
          auVar10._12_4_ = fVar123 * auVar55._12_4_;
          auVar10._16_4_ = fVar124 * auVar55._16_4_;
          auVar10._20_4_ = fVar125 * auVar55._20_4_;
          auVar10._24_4_ = fVar126 * auVar55._24_4_;
          auVar10._28_4_ = auVar55._28_4_;
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar18),auVar54,
                                    *(undefined1 (*) [32])(uVar16 + 0x40 + uVar18));
          auVar55 = vsubps_avx(ZEXT1632(auVar44),auVar92);
          auVar11._4_4_ = fVar130 * auVar55._4_4_;
          auVar11._0_4_ = fVar127 * auVar55._0_4_;
          auVar11._8_4_ = fVar131 * auVar55._8_4_;
          auVar11._12_4_ = fVar132 * auVar55._12_4_;
          auVar11._16_4_ = fVar133 * auVar55._16_4_;
          auVar11._20_4_ = fVar134 * auVar55._20_4_;
          auVar11._24_4_ = fVar135 * auVar55._24_4_;
          auVar11._28_4_ = auVar55._28_4_;
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar21),auVar54,
                                    *(undefined1 (*) [32])(uVar16 + 0x40 + uVar21));
          auVar55 = vsubps_avx(ZEXT1632(auVar44),auVar94);
          auVar12._4_4_ = fVar138 * auVar55._4_4_;
          auVar12._0_4_ = fVar136 * auVar55._0_4_;
          auVar12._8_4_ = fVar139 * auVar55._8_4_;
          auVar12._12_4_ = fVar140 * auVar55._12_4_;
          auVar12._16_4_ = fVar141 * auVar55._16_4_;
          auVar12._20_4_ = fVar142 * auVar55._20_4_;
          auVar12._24_4_ = fVar143 * auVar55._24_4_;
          auVar12._28_4_ = auVar55._28_4_;
          auVar55 = vminps_avx(auVar11,auVar12);
          auVar7 = vminps_avx(auVar43._0_32_,auVar10);
          auVar55 = vminps_avx(auVar7,auVar55);
          auVar55 = vcmpps_avx(local_24c0,auVar55,2);
          if (((uint)uVar24 & 7) == 6) {
            auVar7 = vcmpps_avx(*(undefined1 (*) [32])(uVar16 + 0x1c0),auVar54,2);
            auVar6 = vcmpps_avx(auVar54,*(undefined1 (*) [32])(uVar16 + 0x1e0),1);
            auVar7 = vandps_avx(auVar7,auVar6);
            auVar55 = vandps_avx(auVar7,auVar55);
            auVar44 = vpackssdw_avx(auVar55._0_16_,auVar55._16_16_);
          }
          else {
            auVar44 = vpackssdw_avx(auVar55._0_16_,auVar55._16_16_);
          }
          auVar44 = vpsllw_avx(auVar44,0xf);
          auVar44 = vpacksswb_avx(auVar44,auVar44);
          k = (size_t)(byte)(SUB161(auVar44 >> 7,0) & 1 | (SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                             (SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                             (SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                             (SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                             (SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                             (SUB161(auVar44 >> 0x37,0) & 1) << 6 | SUB161(auVar44 >> 0x3f,0) << 7);
        }
        if ((uVar24 & 8) == 0) {
          if (k == 0) {
            iVar14 = 4;
          }
          else {
            uVar16 = uVar24 & 0xfffffffffffffff0;
            lVar8 = 0;
            for (uVar24 = k; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
              lVar8 = lVar8 + 1;
            }
            iVar14 = 0;
            uVar31 = k - 1 & k;
            uVar24 = *(ulong *)(uVar16 + lVar8 * 8);
            if (uVar31 != 0) {
              uVar3 = *(uint *)(local_24c0 + lVar8 * 4);
              lVar8 = 0;
              for (uVar18 = uVar31; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                lVar8 = lVar8 + 1;
              }
              uVar31 = uVar31 - 1 & uVar31;
              uVar30 = *(ulong *)(uVar16 + lVar8 * 8);
              uVar4 = *(uint *)(local_24c0 + lVar8 * 4);
              uVar18 = local_28a8;
              uVar21 = local_28b0;
              if (uVar31 == 0) {
                if (uVar3 < uVar4) {
                  *(ulong *)*local_28b8 = uVar30;
                  *(uint *)(*local_28b8 + 8) = uVar4;
                  local_28b8 = local_28b8 + 1;
                }
                else {
                  *(ulong *)*local_28b8 = uVar24;
                  *(uint *)(*local_28b8 + 8) = uVar3;
                  uVar24 = uVar30;
                  local_28b8 = local_28b8 + 1;
                }
              }
              else {
                auVar44._8_8_ = 0;
                auVar44._0_8_ = uVar24;
                auVar44 = vpunpcklqdq_avx(auVar44,ZEXT416(uVar3));
                auVar56._8_8_ = 0;
                auVar56._0_8_ = uVar30;
                auVar56 = vpunpcklqdq_avx(auVar56,ZEXT416(uVar4));
                lVar8 = 0;
                for (uVar24 = uVar31; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000)
                {
                  lVar8 = lVar8 + 1;
                }
                uVar31 = uVar31 - 1 & uVar31;
                auVar60._8_8_ = 0;
                auVar60._0_8_ = *(ulong *)(uVar16 + lVar8 * 8);
                auVar45 = vpunpcklqdq_avx(auVar60,ZEXT416(*(uint *)(local_24c0 + lVar8 * 4)));
                auVar60 = vpcmpgtd_avx(auVar56,auVar44);
                if (uVar31 == 0) {
                  auVar71 = vpshufd_avx(auVar60,0xaa);
                  auVar60 = vblendvps_avx(auVar56,auVar44,auVar71);
                  auVar44 = vblendvps_avx(auVar44,auVar56,auVar71);
                  auVar56 = vpcmpgtd_avx(auVar45,auVar60);
                  auVar71 = vpshufd_avx(auVar56,0xaa);
                  auVar56 = vblendvps_avx(auVar45,auVar60,auVar71);
                  auVar60 = vblendvps_avx(auVar60,auVar45,auVar71);
                  auVar45 = vpcmpgtd_avx(auVar60,auVar44);
                  auVar71 = vpshufd_avx(auVar45,0xaa);
                  auVar45 = vblendvps_avx(auVar60,auVar44,auVar71);
                  auVar44 = vblendvps_avx(auVar44,auVar60,auVar71);
                  *local_28b8 = auVar44;
                  local_28b8[1] = auVar45;
                  uVar24 = auVar56._0_8_;
                  local_28b8 = local_28b8 + 2;
                }
                else {
                  lVar8 = 0;
                  for (uVar24 = uVar31; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000
                      ) {
                    lVar8 = lVar8 + 1;
                  }
                  uVar31 = uVar31 - 1 & uVar31;
                  auVar71._8_8_ = 0;
                  auVar71._0_8_ = *(ulong *)(uVar16 + lVar8 * 8);
                  auVar71 = vpunpcklqdq_avx(auVar71,ZEXT416(*(uint *)(local_24c0 + lVar8 * 4)));
                  if (uVar31 == 0) {
                    auVar48 = vpshufd_avx(auVar60,0xaa);
                    auVar60 = vblendvps_avx(auVar56,auVar44,auVar48);
                    auVar44 = vblendvps_avx(auVar44,auVar56,auVar48);
                    auVar56 = vpcmpgtd_avx(auVar71,auVar45);
                    auVar48 = vpshufd_avx(auVar56,0xaa);
                    auVar56 = vblendvps_avx(auVar71,auVar45,auVar48);
                    auVar45 = vblendvps_avx(auVar45,auVar71,auVar48);
                    auVar71 = vpcmpgtd_avx(auVar45,auVar44);
                    auVar48 = vpshufd_avx(auVar71,0xaa);
                    auVar71 = vblendvps_avx(auVar45,auVar44,auVar48);
                    auVar44 = vblendvps_avx(auVar44,auVar45,auVar48);
                    auVar45 = vpcmpgtd_avx(auVar56,auVar60);
                    auVar48 = vpshufd_avx(auVar45,0xaa);
                    auVar45 = vblendvps_avx(auVar56,auVar60,auVar48);
                    auVar56 = vblendvps_avx(auVar60,auVar56,auVar48);
                    auVar60 = vpcmpgtd_avx(auVar71,auVar56);
                    auVar48 = vpshufd_avx(auVar60,0xaa);
                    auVar60 = vblendvps_avx(auVar71,auVar56,auVar48);
                    auVar56 = vblendvps_avx(auVar56,auVar71,auVar48);
                    *local_28b8 = auVar44;
                    local_28b8[1] = auVar56;
                    local_28b8[2] = auVar60;
                    uVar24 = auVar45._0_8_;
                    local_28b8 = local_28b8 + 3;
                  }
                  else {
                    *local_28b8 = auVar44;
                    local_28b8[1] = auVar56;
                    local_28b8[2] = auVar45;
                    local_28b8[3] = auVar71;
                    lVar8 = 0x30;
                    do {
                      lVar20 = lVar8;
                      lVar8 = 0;
                      for (uVar24 = uVar31; (uVar24 & 1) == 0;
                          uVar24 = uVar24 >> 1 | 0x8000000000000000) {
                        lVar8 = lVar8 + 1;
                      }
                      auVar45._8_8_ = 0;
                      auVar45._0_8_ = *(ulong *)(uVar16 + lVar8 * 8);
                      auVar44 = vpunpcklqdq_avx(auVar45,ZEXT416(*(uint *)(local_24c0 + lVar8 * 4)));
                      *(undefined1 (*) [16])(local_28b8[1] + lVar20) = auVar44;
                      uVar31 = uVar31 - 1 & uVar31;
                      lVar8 = lVar20 + 0x10;
                    } while (uVar31 != 0);
                    pauVar13 = (undefined1 (*) [16])(local_28b8[1] + lVar20);
                    if (lVar20 + 0x10 != 0) {
                      local_28c0 = 0x10;
                      pauVar22 = local_28b8;
                      do {
                        auVar44 = pauVar22[1];
                        uVar3 = *(uint *)(pauVar22[1] + 8);
                        pauVar22 = pauVar22 + 1;
                        uVar24 = local_28c0;
                        do {
                          if (uVar3 <= *(uint *)(local_28b8[-1] + uVar24 + 8)) {
                            pauVar23 = (undefined1 (*) [16])(*local_28b8 + uVar24);
                            break;
                          }
                          *(undefined1 (*) [16])(*local_28b8 + uVar24) =
                               *(undefined1 (*) [16])(local_28b8[-1] + uVar24);
                          uVar24 = uVar24 + -0x10;
                          pauVar23 = local_28b8;
                        } while (uVar24 != 0);
                        *pauVar23 = auVar44;
                        local_28c0 = local_28c0 + 0x10;
                      } while (pauVar13 != pauVar22);
                    }
                    uVar24 = *(ulong *)*pauVar13;
                    local_28b8 = pauVar13;
                  }
                  auVar84 = ZEXT3264(auVar53);
                  auVar93 = ZEXT3264(auVar92);
                  auVar95 = ZEXT3264(auVar94);
                  auVar146 = ZEXT3264(local_26c0);
                }
              }
            }
          }
        }
        else {
          iVar14 = 6;
        }
      } while (iVar14 == 0);
    } while (iVar14 != 6);
    local_27c0 = (ulong)((uint)uVar24 & 0xf) - 8;
    local_27d8 = k;
    if (local_27c0 != 0) {
      uVar24 = uVar24 & 0xfffffffffffffff0;
      local_27b8 = 0;
      pRVar19 = ray;
      sVar32 = sVar34;
      local_28c0 = uVar24;
      do {
        ray = local_27c8;
        sVar34 = local_27d0;
        lVar17 = local_27b8 * 0x50;
        pSVar29 = context->scene;
        pGVar5 = (pSVar29->geometries).items[*(uint *)(uVar24 + 0x30 + lVar17)].ptr;
        fVar96 = (pGVar5->time_range).lower;
        fVar96 = pGVar5->fnumTimeSegments *
                 ((*(float *)(pRVar19 + sVar32 * 4 + 0xe0) - fVar96) /
                 ((pGVar5->time_range).upper - fVar96));
        auVar44 = vroundss_avx(ZEXT416((uint)fVar96),ZEXT416((uint)fVar96),9);
        auVar44 = vminss_avx(auVar44,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
        auVar57 = vmaxss_avx(ZEXT816(0),auVar44);
        lVar20 = (long)(int)auVar57._0_4_ * 0x38;
        uVar35 = (ulong)*(uint *)(uVar24 + 4 + lVar17);
        lVar8 = *(long *)(*(long *)&pGVar5[2].numPrimitives + lVar20);
        lVar20 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar20);
        auVar44 = *(undefined1 (*) [16])(lVar8 + (ulong)*(uint *)(uVar24 + lVar17) * 4);
        uVar18 = (ulong)*(uint *)(uVar24 + 0x10 + lVar17);
        auVar56 = *(undefined1 (*) [16])(lVar8 + uVar18 * 4);
        uVar25 = (ulong)*(uint *)(uVar24 + 0x20 + lVar17);
        auVar63 = *(undefined1 (*) [16])(lVar8 + uVar25 * 4);
        auVar60 = *(undefined1 (*) [16])(lVar8 + uVar35 * 4);
        uVar26 = (ulong)*(uint *)(local_28c0 + 0x14 + lVar17);
        auVar45 = *(undefined1 (*) [16])(lVar8 + uVar26 * 4);
        uVar27 = (ulong)*(uint *)(local_28c0 + 0x24 + lVar17);
        auVar65 = *(undefined1 (*) [16])(lVar8 + uVar27 * 4);
        uVar33 = (ulong)*(uint *)(local_28c0 + 8 + lVar17);
        auVar71 = *(undefined1 (*) [16])(lVar8 + uVar33 * 4);
        uVar31 = (ulong)*(uint *)(local_28c0 + 0x18 + lVar17);
        auVar48 = *(undefined1 (*) [16])(lVar8 + uVar31 * 4);
        uVar28 = (ulong)*(uint *)(local_28c0 + 0x28 + lVar17);
        auVar46 = *(undefined1 (*) [16])(lVar8 + uVar28 * 4);
        uVar21 = (ulong)*(uint *)(local_28c0 + 0xc + lVar17);
        auVar39 = *(undefined1 (*) [16])(lVar8 + uVar21 * 4);
        uVar30 = (ulong)*(uint *)(local_28c0 + 0x1c + lVar17);
        auVar37 = *(undefined1 (*) [16])(lVar8 + uVar30 * 4);
        uVar16 = (ulong)*(uint *)(local_28c0 + 0x2c + lVar17);
        auVar36 = *(undefined1 (*) [16])(lVar8 + uVar16 * 4);
        auVar38 = *(undefined1 (*) [16])(lVar20 + (ulong)*(uint *)(uVar24 + lVar17) * 4);
        auVar47 = *(undefined1 (*) [16])(lVar20 + uVar18 * 4);
        fVar96 = fVar96 - auVar57._0_4_;
        auVar57 = vunpcklps_avx(auVar44,auVar71);
        auVar71 = vunpckhps_avx(auVar44,auVar71);
        auVar58 = vunpcklps_avx(auVar60,auVar39);
        auVar60 = vunpckhps_avx(auVar60,auVar39);
        auVar44 = *(undefined1 (*) [16])(lVar20 + uVar35 * 4);
        auVar61 = vunpcklps_avx(auVar71,auVar60);
        auVar62 = vunpcklps_avx(auVar57,auVar58);
        auVar71 = vunpckhps_avx(auVar57,auVar58);
        auVar39 = vunpcklps_avx(auVar56,auVar48);
        auVar60 = vunpckhps_avx(auVar56,auVar48);
        auVar48 = vunpcklps_avx(auVar45,auVar37);
        auVar45 = vunpckhps_avx(auVar45,auVar37);
        auVar56 = *(undefined1 (*) [16])(lVar20 + uVar33 * 4);
        auVar37 = vunpcklps_avx(auVar60,auVar45);
        auVar57 = vunpcklps_avx(auVar39,auVar48);
        auVar45 = vunpckhps_avx(auVar39,auVar48);
        auVar39 = vunpcklps_avx(auVar63,auVar46);
        auVar48 = vunpckhps_avx(auVar63,auVar46);
        auVar58 = vunpcklps_avx(auVar65,auVar36);
        auVar46 = vunpckhps_avx(auVar65,auVar36);
        auVar60 = *(undefined1 (*) [16])(lVar20 + uVar21 * 4);
        auVar36 = vunpcklps_avx(auVar48,auVar46);
        auVar63 = vunpcklps_avx(auVar39,auVar58);
        auVar48 = vunpckhps_avx(auVar39,auVar58);
        auVar46 = vunpcklps_avx(auVar38,auVar56);
        auVar56 = vunpckhps_avx(auVar38,auVar56);
        auVar39 = vunpcklps_avx(auVar44,auVar60);
        auVar60 = vunpckhps_avx(auVar44,auVar60);
        auVar44 = *(undefined1 (*) [16])(lVar20 + uVar31 * 4);
        auVar38 = vunpcklps_avx(auVar56,auVar60);
        auVar58 = vunpcklps_avx(auVar46,auVar39);
        auVar60 = vunpckhps_avx(auVar46,auVar39);
        auVar39 = vunpcklps_avx(auVar47,auVar44);
        auVar46 = vunpckhps_avx(auVar47,auVar44);
        auVar44 = *(undefined1 (*) [16])(lVar20 + uVar26 * 4);
        auVar56 = *(undefined1 (*) [16])(lVar20 + uVar30 * 4);
        auVar47 = vunpcklps_avx(auVar44,auVar56);
        auVar44 = vunpckhps_avx(auVar44,auVar56);
        auVar65 = vunpcklps_avx(auVar46,auVar44);
        auVar64 = vunpcklps_avx(auVar39,auVar47);
        auVar46 = vunpckhps_avx(auVar39,auVar47);
        auVar44 = *(undefined1 (*) [16])(lVar20 + uVar25 * 4);
        auVar56 = *(undefined1 (*) [16])(lVar20 + uVar28 * 4);
        auVar47 = vunpcklps_avx(auVar44,auVar56);
        auVar39 = vunpckhps_avx(auVar44,auVar56);
        auVar44 = *(undefined1 (*) [16])(lVar20 + uVar27 * 4);
        auVar56 = *(undefined1 (*) [16])(lVar20 + uVar16 * 4);
        auVar66 = vunpcklps_avx(auVar44,auVar56);
        auVar44 = vunpckhps_avx(auVar44,auVar56);
        auVar56 = vunpcklps_avx(auVar39,auVar44);
        auVar39 = vunpcklps_avx(auVar47,auVar66);
        auVar44 = vunpckhps_avx(auVar47,auVar66);
        fVar102 = 1.0 - fVar96;
        auVar120._4_4_ = fVar102;
        auVar120._0_4_ = fVar102;
        auVar120._8_4_ = fVar102;
        auVar120._12_4_ = fVar102;
        auVar76._0_4_ = fVar96 * auVar58._0_4_;
        auVar76._4_4_ = fVar96 * auVar58._4_4_;
        auVar76._8_4_ = fVar96 * auVar58._8_4_;
        auVar76._12_4_ = fVar96 * auVar58._12_4_;
        auVar47 = vfmadd231ps_fma(auVar76,auVar120,auVar62);
        auVar97._0_4_ = fVar96 * auVar60._0_4_;
        auVar97._4_4_ = fVar96 * auVar60._4_4_;
        auVar97._8_4_ = fVar96 * auVar60._8_4_;
        auVar97._12_4_ = fVar96 * auVar60._12_4_;
        auVar60 = vfmadd231ps_fma(auVar97,auVar120,auVar71);
        auVar85._0_4_ = fVar96 * auVar38._0_4_;
        auVar85._4_4_ = fVar96 * auVar38._4_4_;
        auVar85._8_4_ = fVar96 * auVar38._8_4_;
        auVar85._12_4_ = fVar96 * auVar38._12_4_;
        auVar71 = vfmadd231ps_fma(auVar85,auVar120,auVar61);
        auVar72._0_4_ = fVar96 * auVar64._0_4_;
        auVar72._4_4_ = fVar96 * auVar64._4_4_;
        auVar72._8_4_ = fVar96 * auVar64._8_4_;
        auVar72._12_4_ = fVar96 * auVar64._12_4_;
        auVar38 = vfmadd231ps_fma(auVar72,auVar120,auVar57);
        auVar64._0_4_ = fVar96 * auVar46._0_4_;
        auVar64._4_4_ = fVar96 * auVar46._4_4_;
        auVar64._8_4_ = fVar96 * auVar46._8_4_;
        auVar64._12_4_ = fVar96 * auVar46._12_4_;
        auVar45 = vfmadd231ps_fma(auVar64,auVar120,auVar45);
        puVar1 = (undefined8 *)(local_28c0 + 0x30 + lVar17);
        local_2610 = *puVar1;
        uStack_2608 = puVar1[1];
        puVar1 = (undefined8 *)(local_28c0 + 0x40 + lVar17);
        auVar46._0_4_ = fVar96 * auVar65._0_4_;
        auVar46._4_4_ = fVar96 * auVar65._4_4_;
        auVar46._8_4_ = fVar96 * auVar65._8_4_;
        auVar46._12_4_ = fVar96 * auVar65._12_4_;
        auVar46 = vfmadd231ps_fma(auVar46,auVar120,auVar37);
        auVar57._0_4_ = fVar96 * auVar39._0_4_;
        auVar57._4_4_ = fVar96 * auVar39._4_4_;
        auVar57._8_4_ = fVar96 * auVar39._8_4_;
        auVar57._12_4_ = fVar96 * auVar39._12_4_;
        auVar61._0_4_ = fVar96 * auVar44._0_4_;
        auVar61._4_4_ = fVar96 * auVar44._4_4_;
        auVar61._8_4_ = fVar96 * auVar44._8_4_;
        auVar61._12_4_ = fVar96 * auVar44._12_4_;
        auVar109._0_4_ = fVar96 * auVar56._0_4_;
        auVar109._4_4_ = fVar96 * auVar56._4_4_;
        auVar109._8_4_ = fVar96 * auVar56._8_4_;
        auVar109._12_4_ = fVar96 * auVar56._12_4_;
        auVar39 = vfmadd231ps_fma(auVar57,auVar120,auVar63);
        auVar48 = vfmadd231ps_fma(auVar61,auVar120,auVar48);
        auVar37 = vfmadd231ps_fma(auVar109,auVar120,auVar36);
        local_2780 = *puVar1;
        uStack_2778 = puVar1[1];
        local_2740 = &local_28c1;
        uVar15 = *(undefined4 *)(local_27c8 + local_27d0 * 4);
        auVar36._4_4_ = uVar15;
        auVar36._0_4_ = uVar15;
        auVar36._8_4_ = uVar15;
        auVar36._12_4_ = uVar15;
        uVar15 = *(undefined4 *)(local_27c8 + local_27d0 * 4 + 0x20);
        auVar128._4_4_ = uVar15;
        auVar128._0_4_ = uVar15;
        auVar128._8_4_ = uVar15;
        auVar128._12_4_ = uVar15;
        uVar15 = *(undefined4 *)(local_27c8 + local_27d0 * 4 + 0x40);
        auVar137._4_4_ = uVar15;
        auVar137._0_4_ = uVar15;
        auVar137._8_4_ = uVar15;
        auVar137._12_4_ = uVar15;
        local_2860 = vsubps_avx(auVar47,auVar36);
        local_2870 = vsubps_avx(auVar60,auVar128);
        local_2810 = vsubps_avx(auVar71,auVar137);
        auVar44 = vsubps_avx(auVar38,auVar36);
        auVar56 = vsubps_avx(auVar45,auVar128);
        auVar60 = vsubps_avx(auVar46,auVar137);
        auVar45 = vsubps_avx(auVar39,auVar36);
        auVar71 = vsubps_avx(auVar48,auVar128);
        auVar48 = vsubps_avx(auVar37,auVar137);
        local_2820 = vsubps_avx(auVar45,local_2860);
        local_2620 = vsubps_avx(auVar71,local_2870);
        local_2830 = vsubps_avx(auVar48,local_2810);
        auVar37._0_4_ = auVar45._0_4_ + local_2860._0_4_;
        auVar37._4_4_ = auVar45._4_4_ + local_2860._4_4_;
        auVar37._8_4_ = auVar45._8_4_ + local_2860._8_4_;
        auVar37._12_4_ = auVar45._12_4_ + local_2860._12_4_;
        auVar62._0_4_ = auVar71._0_4_ + local_2870._0_4_;
        auVar62._4_4_ = auVar71._4_4_ + local_2870._4_4_;
        auVar62._8_4_ = auVar71._8_4_ + local_2870._8_4_;
        auVar62._12_4_ = auVar71._12_4_ + local_2870._12_4_;
        fVar102 = local_2810._0_4_;
        auVar65._0_4_ = auVar48._0_4_ + fVar102;
        fVar103 = local_2810._4_4_;
        auVar65._4_4_ = auVar48._4_4_ + fVar103;
        fVar104 = local_2810._8_4_;
        auVar65._8_4_ = auVar48._8_4_ + fVar104;
        fVar105 = local_2810._12_4_;
        auVar65._12_4_ = auVar48._12_4_ + fVar105;
        auVar129._0_4_ = local_2830._0_4_ * auVar62._0_4_;
        auVar129._4_4_ = local_2830._4_4_ * auVar62._4_4_;
        auVar129._8_4_ = local_2830._8_4_ * auVar62._8_4_;
        auVar129._12_4_ = local_2830._12_4_ * auVar62._12_4_;
        auVar39 = vfmsub231ps_fma(auVar129,local_2620,auVar65);
        auVar66._0_4_ = local_2820._0_4_ * auVar65._0_4_;
        auVar66._4_4_ = local_2820._4_4_ * auVar65._4_4_;
        auVar66._8_4_ = local_2820._8_4_ * auVar65._8_4_;
        auVar66._12_4_ = local_2820._12_4_ * auVar65._12_4_;
        auVar46 = vfmsub231ps_fma(auVar66,local_2830,auVar37);
        auVar38._0_4_ = local_2620._0_4_ * auVar37._0_4_;
        auVar38._4_4_ = local_2620._4_4_ * auVar37._4_4_;
        auVar38._8_4_ = local_2620._8_4_ * auVar37._8_4_;
        auVar38._12_4_ = local_2620._12_4_ * auVar37._12_4_;
        auVar37 = vfmsub231ps_fma(auVar38,local_2820,auVar62);
        fVar96 = *(float *)(local_27c8 + local_27d0 * 4 + 0xc0);
        auVar58._0_4_ = fVar96 * auVar37._0_4_;
        auVar58._4_4_ = fVar96 * auVar37._4_4_;
        auVar58._8_4_ = fVar96 * auVar37._8_4_;
        auVar58._12_4_ = fVar96 * auVar37._12_4_;
        uVar15 = *(undefined4 *)(local_27c8 + local_27d0 * 4 + 0xa0);
        auVar98._4_4_ = uVar15;
        auVar98._0_4_ = uVar15;
        auVar98._8_4_ = uVar15;
        auVar98._12_4_ = uVar15;
        auVar46 = vfmadd231ps_fma(auVar58,auVar98,auVar46);
        uVar15 = *(undefined4 *)(local_27c8 + local_27d0 * 4 + 0x80);
        local_28a0._4_4_ = uVar15;
        local_28a0._0_4_ = uVar15;
        local_28a0._8_4_ = uVar15;
        local_28a0._12_4_ = uVar15;
        local_2660 = vfmadd231ps_fma(auVar46,local_28a0,auVar39);
        local_2630 = vsubps_avx(local_2870,auVar56);
        local_2650 = vsubps_avx(local_2810,auVar60);
        auVar63._0_4_ = local_2870._0_4_ + auVar56._0_4_;
        auVar63._4_4_ = local_2870._4_4_ + auVar56._4_4_;
        auVar63._8_4_ = local_2870._8_4_ + auVar56._8_4_;
        auVar63._12_4_ = local_2870._12_4_ + auVar56._12_4_;
        auVar67._0_4_ = auVar60._0_4_ + fVar102;
        auVar67._4_4_ = auVar60._4_4_ + fVar103;
        auVar67._8_4_ = auVar60._8_4_ + fVar104;
        auVar67._12_4_ = auVar60._12_4_ + fVar105;
        fVar106 = local_2650._0_4_;
        auVar77._0_4_ = auVar63._0_4_ * fVar106;
        fVar108 = local_2650._4_4_;
        auVar77._4_4_ = auVar63._4_4_ * fVar108;
        fVar111 = local_2650._8_4_;
        auVar77._8_4_ = auVar63._8_4_ * fVar111;
        fVar113 = local_2650._12_4_;
        auVar77._12_4_ = auVar63._12_4_ * fVar113;
        auVar39 = vfmsub231ps_fma(auVar77,local_2630,auVar67);
        local_2640 = vsubps_avx(local_2860,auVar44);
        fVar144 = local_2640._0_4_;
        auVar86._0_4_ = fVar144 * auVar67._0_4_;
        fVar147 = local_2640._4_4_;
        auVar86._4_4_ = fVar147 * auVar67._4_4_;
        fVar148 = local_2640._8_4_;
        auVar86._8_4_ = fVar148 * auVar67._8_4_;
        fVar149 = local_2640._12_4_;
        auVar86._12_4_ = fVar149 * auVar67._12_4_;
        auVar68._0_4_ = local_2860._0_4_ + auVar44._0_4_;
        auVar68._4_4_ = local_2860._4_4_ + auVar44._4_4_;
        auVar68._8_4_ = local_2860._8_4_ + auVar44._8_4_;
        auVar68._12_4_ = local_2860._12_4_ + auVar44._12_4_;
        auVar46 = vfmsub231ps_fma(auVar86,local_2650,auVar68);
        fVar107 = local_2630._0_4_;
        auVar69._0_4_ = auVar68._0_4_ * fVar107;
        fVar110 = local_2630._4_4_;
        auVar69._4_4_ = auVar68._4_4_ * fVar110;
        fVar112 = local_2630._8_4_;
        auVar69._8_4_ = auVar68._8_4_ * fVar112;
        fVar114 = local_2630._12_4_;
        auVar69._12_4_ = auVar68._12_4_ * fVar114;
        auVar37 = vfmsub231ps_fma(auVar69,local_2640,auVar63);
        auVar70._0_4_ = fVar96 * auVar37._0_4_;
        auVar70._4_4_ = fVar96 * auVar37._4_4_;
        auVar70._8_4_ = fVar96 * auVar37._8_4_;
        auVar70._12_4_ = fVar96 * auVar37._12_4_;
        auVar46 = vfmadd231ps_fma(auVar70,auVar98,auVar46);
        local_2760 = vfmadd231ps_fma(auVar46,local_28a0,auVar39);
        auVar46 = vsubps_avx(auVar44,auVar45);
        auVar78._0_4_ = auVar45._0_4_ + auVar44._0_4_;
        auVar78._4_4_ = auVar45._4_4_ + auVar44._4_4_;
        auVar78._8_4_ = auVar45._8_4_ + auVar44._8_4_;
        auVar78._12_4_ = auVar45._12_4_ + auVar44._12_4_;
        auVar45 = vsubps_avx(auVar56,auVar71);
        auVar39._0_4_ = auVar56._0_4_ + auVar71._0_4_;
        auVar39._4_4_ = auVar56._4_4_ + auVar71._4_4_;
        auVar39._8_4_ = auVar56._8_4_ + auVar71._8_4_;
        auVar39._12_4_ = auVar56._12_4_ + auVar71._12_4_;
        auVar71 = vsubps_avx(auVar60,auVar48);
        auVar47._0_4_ = auVar60._0_4_ + auVar48._0_4_;
        auVar47._4_4_ = auVar60._4_4_ + auVar48._4_4_;
        auVar47._8_4_ = auVar60._8_4_ + auVar48._8_4_;
        auVar47._12_4_ = auVar60._12_4_ + auVar48._12_4_;
        auVar87._0_4_ = auVar39._0_4_ * auVar71._0_4_;
        auVar87._4_4_ = auVar39._4_4_ * auVar71._4_4_;
        auVar87._8_4_ = auVar39._8_4_ * auVar71._8_4_;
        auVar87._12_4_ = auVar39._12_4_ * auVar71._12_4_;
        auVar56 = vfmsub231ps_fma(auVar87,auVar45,auVar47);
        auVar48._0_4_ = auVar47._0_4_ * auVar46._0_4_;
        auVar48._4_4_ = auVar47._4_4_ * auVar46._4_4_;
        auVar48._8_4_ = auVar47._8_4_ * auVar46._8_4_;
        auVar48._12_4_ = auVar47._12_4_ * auVar46._12_4_;
        auVar44 = vfmsub231ps_fma(auVar48,auVar71,auVar78);
        auVar79._0_4_ = auVar45._0_4_ * auVar78._0_4_;
        auVar79._4_4_ = auVar45._4_4_ * auVar78._4_4_;
        auVar79._8_4_ = auVar45._8_4_ * auVar78._8_4_;
        auVar79._12_4_ = auVar45._12_4_ * auVar78._12_4_;
        auVar60 = vfmsub231ps_fma(auVar79,auVar46,auVar39);
        auVar80._0_4_ = fVar96 * auVar60._0_4_;
        auVar80._4_4_ = fVar96 * auVar60._4_4_;
        auVar80._8_4_ = fVar96 * auVar60._8_4_;
        auVar80._12_4_ = fVar96 * auVar60._12_4_;
        auVar44 = vfmadd231ps_fma(auVar80,auVar98,auVar44);
        auVar60 = vfmadd231ps_fma(auVar44,local_28a0,auVar56);
        local_2770 = local_2660._0_4_;
        fStack_276c = local_2660._4_4_;
        fStack_2768 = local_2660._8_4_;
        fStack_2764 = local_2660._12_4_;
        local_2750._0_4_ = auVar60._0_4_ + local_2770 + local_2760._0_4_;
        local_2750._4_4_ = auVar60._4_4_ + fStack_276c + local_2760._4_4_;
        local_2750._8_4_ = auVar60._8_4_ + fStack_2768 + local_2760._8_4_;
        local_2750._12_4_ = auVar60._12_4_ + fStack_2764 + local_2760._12_4_;
        auVar145._8_4_ = 0x7fffffff;
        auVar145._0_8_ = 0x7fffffff7fffffff;
        auVar145._12_4_ = 0x7fffffff;
        auVar44 = vminps_avx(local_2660,local_2760);
        auVar44 = vminps_avx(auVar44,auVar60);
        local_2670 = vandps_avx(local_2750,auVar145);
        auVar99._0_4_ = local_2670._0_4_ * 1.1920929e-07;
        auVar99._4_4_ = local_2670._4_4_ * 1.1920929e-07;
        auVar99._8_4_ = local_2670._8_4_ * 1.1920929e-07;
        auVar99._12_4_ = local_2670._12_4_ * 1.1920929e-07;
        uVar18 = CONCAT44(auVar99._4_4_,auVar99._0_4_);
        auVar88._0_8_ = uVar18 ^ 0x8000000080000000;
        auVar88._8_4_ = -auVar99._8_4_;
        auVar88._12_4_ = -auVar99._12_4_;
        auVar44 = vcmpps_avx(auVar44,auVar88,5);
        auVar56 = vmaxps_avx(local_2660,local_2760);
        auVar56 = vmaxps_avx(auVar56,auVar60);
        auVar56 = vcmpps_avx(auVar56,auVar99,2);
        local_2850 = vorps_avx(auVar44,auVar56);
        uVar24 = local_28c0;
        if ((((local_2850 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (local_2850 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (local_2850 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            local_2850[0xf] < '\0') {
          auVar49._0_4_ = fVar107 * local_2830._0_4_;
          auVar49._4_4_ = fVar110 * local_2830._4_4_;
          auVar49._8_4_ = fVar112 * local_2830._8_4_;
          auVar49._12_4_ = fVar114 * local_2830._12_4_;
          auVar81._0_4_ = fVar144 * local_2620._0_4_;
          auVar81._4_4_ = fVar147 * local_2620._4_4_;
          auVar81._8_4_ = fVar148 * local_2620._8_4_;
          auVar81._12_4_ = fVar149 * local_2620._12_4_;
          auVar60 = vfmsub213ps_fma(local_2620,local_2650,auVar49);
          auVar89._0_4_ = auVar45._0_4_ * fVar106;
          auVar89._4_4_ = auVar45._4_4_ * fVar108;
          auVar89._8_4_ = auVar45._8_4_ * fVar111;
          auVar89._12_4_ = auVar45._12_4_ * fVar113;
          auVar100._0_4_ = fVar144 * auVar71._0_4_;
          auVar100._4_4_ = fVar147 * auVar71._4_4_;
          auVar100._8_4_ = fVar148 * auVar71._8_4_;
          auVar100._12_4_ = fVar149 * auVar71._12_4_;
          auVar71 = vfmsub213ps_fma(auVar71,local_2630,auVar89);
          auVar44 = vandps_avx(auVar145,auVar49);
          auVar56 = vandps_avx(auVar145,auVar89);
          auVar44 = vcmpps_avx(auVar44,auVar56,1);
          local_26f0 = vblendvps_avx(auVar71,auVar60,auVar44);
          auVar73._0_4_ = fVar107 * auVar46._0_4_;
          auVar73._4_4_ = fVar110 * auVar46._4_4_;
          auVar73._8_4_ = fVar112 * auVar46._8_4_;
          auVar73._12_4_ = fVar114 * auVar46._12_4_;
          auVar60 = vfmsub213ps_fma(auVar46,local_2650,auVar100);
          auVar90._0_4_ = local_2820._0_4_ * fVar106;
          auVar90._4_4_ = local_2820._4_4_ * fVar108;
          auVar90._8_4_ = local_2820._8_4_ * fVar111;
          auVar90._12_4_ = local_2820._12_4_ * fVar113;
          auVar71 = vfmsub213ps_fma(local_2830,local_2640,auVar90);
          auVar44 = vandps_avx(auVar145,auVar90);
          auVar56 = vandps_avx(auVar100,auVar145);
          auVar44 = vcmpps_avx(auVar44,auVar56,1);
          local_26e0 = vblendvps_avx(auVar60,auVar71,auVar44);
          auVar60 = vfmsub213ps_fma(local_2820,local_2630,auVar81);
          auVar45 = vfmsub213ps_fma(auVar45,local_2640,auVar73);
          auVar44 = vandps_avx(auVar145,auVar81);
          auVar56 = vandps_avx(auVar145,auVar73);
          auVar44 = vcmpps_avx(auVar44,auVar56,1);
          local_26d0 = vblendvps_avx(auVar45,auVar60,auVar44);
          auVar74._0_4_ = local_26d0._0_4_ * fVar96;
          auVar74._4_4_ = local_26d0._4_4_ * fVar96;
          auVar74._8_4_ = local_26d0._8_4_ * fVar96;
          auVar74._12_4_ = local_26d0._12_4_ * fVar96;
          auVar44 = vfmadd213ps_fma(auVar98,local_26e0,auVar74);
          auVar44 = vfmadd213ps_fma(local_28a0,local_26f0,auVar44);
          auVar75._0_4_ = auVar44._0_4_ + auVar44._0_4_;
          auVar75._4_4_ = auVar44._4_4_ + auVar44._4_4_;
          auVar75._8_4_ = auVar44._8_4_ + auVar44._8_4_;
          auVar75._12_4_ = auVar44._12_4_ + auVar44._12_4_;
          auVar82._0_4_ = local_26d0._0_4_ * fVar102;
          auVar82._4_4_ = local_26d0._4_4_ * fVar103;
          auVar82._8_4_ = local_26d0._8_4_ * fVar104;
          auVar82._12_4_ = local_26d0._12_4_ * fVar105;
          auVar44 = vfmadd213ps_fma(local_2870,local_26e0,auVar82);
          auVar56 = vfmadd213ps_fma(local_2860,local_26f0,auVar44);
          auVar44 = vrcpps_avx(auVar75);
          auVar101._8_4_ = 0x3f800000;
          auVar101._0_8_ = &DAT_3f8000003f800000;
          auVar101._12_4_ = 0x3f800000;
          auVar60 = vfnmadd213ps_fma(auVar44,auVar75,auVar101);
          auVar44 = vfmadd132ps_fma(auVar60,auVar44,auVar44);
          local_2700._0_4_ = auVar44._0_4_ * (auVar56._0_4_ + auVar56._0_4_);
          local_2700._4_4_ = auVar44._4_4_ * (auVar56._4_4_ + auVar56._4_4_);
          local_2700._8_4_ = auVar44._8_4_ * (auVar56._8_4_ + auVar56._8_4_);
          local_2700._12_4_ = auVar44._12_4_ * (auVar56._12_4_ + auVar56._12_4_);
          auVar43 = ZEXT1664(local_2700);
          uVar15 = *(undefined4 *)(local_27c8 + local_27d0 * 4 + 0x60);
          auVar83._4_4_ = uVar15;
          auVar83._0_4_ = uVar15;
          auVar83._8_4_ = uVar15;
          auVar83._12_4_ = uVar15;
          auVar44 = vcmpps_avx(auVar83,local_2700,2);
          uVar15 = *(undefined4 *)(local_27c8 + local_27d0 * 4 + 0x100);
          auVar91._4_4_ = uVar15;
          auVar91._0_4_ = uVar15;
          auVar91._8_4_ = uVar15;
          auVar91._12_4_ = uVar15;
          auVar56 = vcmpps_avx(local_2700,auVar91,2);
          auVar44 = vandps_avx(auVar44,auVar56);
          auVar60 = local_2850 & auVar44;
          if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar60[0xf] < '\0') {
            auVar44 = vandps_avx(auVar44,local_2850);
            auVar60 = vcmpps_avx(auVar75,_DAT_01feba10,4);
            auVar45 = auVar60 & auVar44;
            if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar45[0xf] < '\0') {
              local_2840 = vandps_avx(auVar44,auVar60);
              pRVar19 = &local_28c1;
              local_2740 = pRVar19;
              local_2730 = local_2840;
              auVar44 = vrcpps_avx(local_2750);
              auVar59._8_4_ = 0x3f800000;
              auVar59._0_8_ = &DAT_3f8000003f800000;
              auVar59._12_4_ = 0x3f800000;
              auVar60 = vfnmadd213ps_fma(local_2750,auVar44,auVar59);
              auVar60 = vfmadd132ps_fma(auVar60,auVar44,auVar44);
              auVar50._8_4_ = 0x219392ef;
              auVar50._0_8_ = 0x219392ef219392ef;
              auVar50._12_4_ = 0x219392ef;
              auVar44 = vcmpps_avx(local_2670,auVar50,5);
              auVar44 = vandps_avx(auVar60,auVar44);
              auVar40._0_4_ = local_2770 * auVar44._0_4_;
              auVar40._4_4_ = fStack_276c * auVar44._4_4_;
              auVar40._8_4_ = fStack_2768 * auVar44._8_4_;
              auVar40._12_4_ = fStack_2764 * auVar44._12_4_;
              local_2720 = vminps_avx(auVar40,auVar59);
              auVar41._0_4_ = auVar44._0_4_ * local_2760._0_4_;
              auVar41._4_4_ = auVar44._4_4_ * local_2760._4_4_;
              auVar41._8_4_ = auVar44._8_4_ * local_2760._8_4_;
              auVar41._12_4_ = auVar44._12_4_ * local_2760._12_4_;
              local_2710 = vminps_avx(auVar41,auVar59);
              auVar51._8_4_ = 0x7f800000;
              auVar51._0_8_ = 0x7f8000007f800000;
              auVar51._12_4_ = 0x7f800000;
              auVar44 = vblendvps_avx(auVar51,local_2700,local_2840);
              auVar60 = vshufps_avx(auVar44,auVar44,0xb1);
              auVar60 = vminps_avx(auVar60,auVar44);
              auVar45 = vshufpd_avx(auVar60,auVar60,1);
              auVar60 = vminps_avx(auVar45,auVar60);
              auVar60 = vcmpps_avx(auVar44,auVar60,0);
              auVar45 = local_2840 & auVar60;
              auVar44 = vpcmpeqd_avx(auVar44,auVar44);
              if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar45[0xf] < '\0') {
                auVar44 = auVar60;
              }
              auVar44 = vandps_avx(local_2840,auVar44);
              auVar53 = vpcmpeqd_avx2(ZEXT1632(auVar56),ZEXT1632(auVar56));
              auVar84 = ZEXT3264(auVar53);
              local_2878 = pSVar29;
              do {
                auVar44 = vpslld_avx(auVar44,0x1f);
                uVar15 = vmovmskps_avx(auVar44);
                lVar8 = 0;
                for (uVar18 = CONCAT44((int)((ulong)pRVar19 >> 0x20),uVar15); (uVar18 & 1) == 0;
                    uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                  lVar8 = lVar8 + 1;
                }
                local_2400 = *(uint *)((long)&local_2610 + lVar8 * 4);
                pRVar19 = (RayHitK<8> *)(ulong)local_2400;
                pGVar5 = (pSVar29->geometries).items[(long)pRVar19].ptr;
                if ((pGVar5->mask & *(uint *)(ray + sVar34 * 4 + 0x120)) == 0) {
                  *(undefined4 *)(local_2840 + lVar8 * 4) = 0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar18 = (ulong)(uint)((int)lVar8 << 2);
                    uVar15 = *(undefined4 *)(local_2720 + uVar18);
                    uVar2 = *(undefined4 *)(local_2710 + uVar18);
                    *(undefined4 *)(ray + sVar34 * 4 + 0x100) = *(undefined4 *)(local_2700 + uVar18)
                    ;
                    *(undefined4 *)(ray + sVar34 * 4 + 0x180) = *(undefined4 *)(local_26f0 + uVar18)
                    ;
                    *(undefined4 *)(ray + sVar34 * 4 + 0x1a0) = *(undefined4 *)(local_26e0 + uVar18)
                    ;
                    *(undefined4 *)(ray + sVar34 * 4 + 0x1c0) = *(undefined4 *)(local_26d0 + uVar18)
                    ;
                    *(undefined4 *)(ray + sVar34 * 4 + 0x1e0) = uVar15;
                    *(undefined4 *)(ray + sVar34 * 4 + 0x200) = uVar2;
                    *(undefined4 *)(ray + sVar34 * 4 + 0x220) =
                         *(undefined4 *)((long)&local_2780 + uVar18);
                    *(uint *)(ray + sVar34 * 4 + 0x240) = local_2400;
                    *(uint *)(ray + sVar34 * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + sVar34 * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  uVar18 = (ulong)(uint)((int)lVar8 * 4);
                  local_2460 = *(undefined4 *)(local_2720 + uVar18);
                  local_2440 = *(undefined4 *)(local_2710 + uVar18);
                  local_2420 = *(undefined4 *)((long)&local_2780 + uVar18);
                  uVar15 = *(undefined4 *)(local_26f0 + uVar18);
                  local_24c0._4_4_ = uVar15;
                  local_24c0._0_4_ = uVar15;
                  local_24c0._8_4_ = uVar15;
                  local_24c0._12_4_ = uVar15;
                  local_24c0._16_4_ = uVar15;
                  local_24c0._20_4_ = uVar15;
                  local_24c0._24_4_ = uVar15;
                  local_24c0._28_4_ = uVar15;
                  uVar15 = *(undefined4 *)(local_26e0 + uVar18);
                  local_24a0._4_4_ = uVar15;
                  local_24a0._0_4_ = uVar15;
                  local_24a0._8_4_ = uVar15;
                  local_24a0._12_4_ = uVar15;
                  local_24a0._16_4_ = uVar15;
                  local_24a0._20_4_ = uVar15;
                  local_24a0._24_4_ = uVar15;
                  local_24a0._28_4_ = uVar15;
                  uVar15 = *(undefined4 *)(local_26d0 + uVar18);
                  local_2480._4_4_ = uVar15;
                  local_2480._0_4_ = uVar15;
                  local_2480._8_4_ = uVar15;
                  local_2480._12_4_ = uVar15;
                  local_2480._16_4_ = uVar15;
                  local_2480._20_4_ = uVar15;
                  local_2480._24_4_ = uVar15;
                  local_2480._28_4_ = uVar15;
                  uStack_245c = local_2460;
                  uStack_2458 = local_2460;
                  uStack_2454 = local_2460;
                  uStack_2450 = local_2460;
                  uStack_244c = local_2460;
                  uStack_2448 = local_2460;
                  uStack_2444 = local_2460;
                  uStack_243c = local_2440;
                  uStack_2438 = local_2440;
                  uStack_2434 = local_2440;
                  uStack_2430 = local_2440;
                  uStack_242c = local_2440;
                  uStack_2428 = local_2440;
                  uStack_2424 = local_2440;
                  uStack_241c = local_2420;
                  uStack_2418 = local_2420;
                  uStack_2414 = local_2420;
                  uStack_2410 = local_2420;
                  uStack_240c = local_2420;
                  uStack_2408 = local_2420;
                  uStack_2404 = local_2420;
                  uStack_23fc = local_2400;
                  uStack_23f8 = local_2400;
                  uStack_23f4 = local_2400;
                  uStack_23f0 = local_2400;
                  uStack_23ec = local_2400;
                  uStack_23e8 = local_2400;
                  uStack_23e4 = local_2400;
                  uStack_23dc = context->user->instID[0];
                  local_23e0 = uStack_23dc;
                  uStack_23d8 = uStack_23dc;
                  uStack_23d4 = uStack_23dc;
                  uStack_23d0 = uStack_23dc;
                  uStack_23cc = uStack_23dc;
                  uStack_23c8 = uStack_23dc;
                  uStack_23c4 = uStack_23dc;
                  uStack_23bc = context->user->instPrimID[0];
                  local_23c0 = uStack_23bc;
                  uStack_23b8 = uStack_23bc;
                  uStack_23b4 = uStack_23bc;
                  uStack_23b0 = uStack_23bc;
                  uStack_23ac = uStack_23bc;
                  uStack_23a8 = uStack_23bc;
                  uStack_23a4 = uStack_23bc;
                  uVar15 = *(undefined4 *)(ray + sVar34 * 4 + 0x100);
                  *(undefined4 *)(ray + sVar34 * 4 + 0x100) = *(undefined4 *)(local_2700 + uVar18);
                  local_26a0 = local_2600._0_8_;
                  uStack_2698 = local_2600._8_8_;
                  uStack_2690 = local_2600._16_8_;
                  uStack_2688 = local_2600._24_8_;
                  local_27b0 = &local_26a0;
                  local_27a8 = pGVar5->userPtr;
                  local_27a0 = context->user;
                  local_2798 = ray;
                  local_2790 = &local_24c0;
                  local_2788 = 8;
                  pRVar19 = (RayHitK<8> *)pGVar5->intersectionFilterN;
                  if (pRVar19 != (RayHitK<8> *)0x0) {
                    local_2890 = auVar43._0_16_;
                    local_28a0._0_4_ = uVar15;
                    auVar53 = ZEXT1632(auVar84._0_16_);
                    pRVar19 = (RayHitK<8> *)(*(code *)pRVar19)(&local_27b0);
                    auVar43 = ZEXT1664(local_2890);
                    auVar53 = vpcmpeqd_avx2(auVar53,auVar53);
                    auVar84 = ZEXT3264(auVar53);
                    uVar24 = local_28c0;
                    pSVar29 = local_2878;
                    uVar15 = local_28a0._0_4_;
                  }
                  auVar92._8_8_ = uStack_2698;
                  auVar92._0_8_ = local_26a0;
                  auVar92._16_8_ = uStack_2690;
                  auVar92._24_8_ = uStack_2688;
                  auVar92 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar92);
                  auVar53 = auVar84._0_32_ & ~auVar92;
                  if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar53 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar53 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar53 >> 0x7f,0) == '\0') &&
                        (auVar53 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar53 >> 0xbf,0) == '\0') &&
                      (auVar53 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar53[0x1f]) {
                    auVar92 = auVar92 ^ auVar84._0_32_;
                  }
                  else {
                    pRVar19 = (RayHitK<8> *)context->args->filter;
                    if ((pRVar19 != (RayHitK<8> *)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      local_2890 = auVar43._0_16_;
                      local_28a0._0_4_ = uVar15;
                      auVar53 = ZEXT1632(auVar84._0_16_);
                      pRVar19 = (RayHitK<8> *)(*(code *)pRVar19)(&local_27b0);
                      auVar43 = ZEXT1664(local_2890);
                      auVar53 = vpcmpeqd_avx2(auVar53,auVar53);
                      auVar84 = ZEXT3264(auVar53);
                      uVar24 = local_28c0;
                      pSVar29 = local_2878;
                      uVar15 = local_28a0._0_4_;
                    }
                    auVar94._8_8_ = uStack_2698;
                    auVar94._0_8_ = local_26a0;
                    auVar94._16_8_ = uStack_2690;
                    auVar94._24_8_ = uStack_2688;
                    auVar94 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar94);
                    auVar92 = auVar94 ^ auVar84._0_32_;
                    auVar53 = auVar84._0_32_ & ~auVar94;
                    if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar53 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar53 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar53 >> 0x7f,0) != '\0') ||
                          (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar53 >> 0xbf,0) != '\0') ||
                        (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar53[0x1f] < '\0') {
                      auVar55._0_4_ = auVar94._0_4_ ^ auVar84._0_4_;
                      auVar55._4_4_ = auVar94._4_4_ ^ auVar84._4_4_;
                      auVar55._8_4_ = auVar94._8_4_ ^ auVar84._8_4_;
                      auVar55._12_4_ = auVar94._12_4_ ^ auVar84._12_4_;
                      auVar55._16_4_ = auVar94._16_4_ ^ auVar84._16_4_;
                      auVar55._20_4_ = auVar94._20_4_ ^ auVar84._20_4_;
                      auVar55._24_4_ = auVar94._24_4_ ^ auVar84._24_4_;
                      auVar55._28_4_ = auVar94._28_4_ ^ auVar84._28_4_;
                      auVar53 = vmaskmovps_avx(auVar55,*local_2790);
                      *(undefined1 (*) [32])(local_2798 + 0x180) = auVar53;
                      auVar53 = vmaskmovps_avx(auVar55,local_2790[1]);
                      *(undefined1 (*) [32])(local_2798 + 0x1a0) = auVar53;
                      auVar53 = vmaskmovps_avx(auVar55,local_2790[2]);
                      *(undefined1 (*) [32])(local_2798 + 0x1c0) = auVar53;
                      auVar53 = vmaskmovps_avx(auVar55,local_2790[3]);
                      *(undefined1 (*) [32])(local_2798 + 0x1e0) = auVar53;
                      auVar53 = vmaskmovps_avx(auVar55,local_2790[4]);
                      *(undefined1 (*) [32])(local_2798 + 0x200) = auVar53;
                      auVar53 = vpmaskmovd_avx2(auVar55,local_2790[5]);
                      *(undefined1 (*) [32])(local_2798 + 0x220) = auVar53;
                      auVar53 = vpmaskmovd_avx2(auVar55,local_2790[6]);
                      *(undefined1 (*) [32])(local_2798 + 0x240) = auVar53;
                      auVar53 = vpmaskmovd_avx2(auVar55,local_2790[7]);
                      *(undefined1 (*) [32])(local_2798 + 0x260) = auVar53;
                      auVar53 = vpmaskmovd_avx2(auVar55,local_2790[8]);
                      *(undefined1 (*) [32])(local_2798 + 0x280) = auVar53;
                      pRVar19 = local_2798;
                    }
                  }
                  if ((((((((auVar92 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar92 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar92 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar92 >> 0x7f,0) == '\0') &&
                        (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar92 >> 0xbf,0) == '\0') &&
                      (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar92[0x1f]) {
                    *(undefined4 *)(ray + sVar34 * 4 + 0x100) = uVar15;
                  }
                  *(undefined4 *)(local_2840 + lVar8 * 4) = 0;
                  uVar15 = *(undefined4 *)(ray + sVar34 * 4 + 0x100);
                  auVar42._4_4_ = uVar15;
                  auVar42._0_4_ = uVar15;
                  auVar42._8_4_ = uVar15;
                  auVar42._12_4_ = uVar15;
                  auVar44 = vcmpps_avx(auVar43._0_16_,auVar42,2);
                  local_2840 = vandps_avx(auVar44,local_2840);
                }
                if ((((local_2840 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (local_2840 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_2840 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < local_2840[0xf]) break;
                auVar52._8_4_ = 0x7f800000;
                auVar52._0_8_ = 0x7f8000007f800000;
                auVar52._12_4_ = 0x7f800000;
                auVar44 = vblendvps_avx(auVar52,auVar43._0_16_,local_2840);
                auVar56 = vshufps_avx(auVar44,auVar44,0xb1);
                auVar56 = vminps_avx(auVar56,auVar44);
                auVar60 = vshufpd_avx(auVar56,auVar56,1);
                auVar56 = vminps_avx(auVar60,auVar56);
                auVar56 = vcmpps_avx(auVar44,auVar56,0);
                auVar60 = local_2840 & auVar56;
                auVar44 = local_2840;
                if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar60[0xf] < '\0') {
                  auVar44 = vandps_avx(auVar56,local_2840);
                }
                auVar44 = vpcmpgtd_avx(ZEXT816(0) << 0x20,auVar44);
              } while( true );
            }
          }
        }
        local_27b8 = local_27b8 + 1;
        pRVar19 = ray;
        sVar32 = sVar34;
      } while (local_27b8 != local_27c0);
    }
    uVar15 = *(undefined4 *)(ray + sVar34 * 4 + 0x100);
    auVar43 = ZEXT3264(CONCAT428(uVar15,CONCAT424(uVar15,CONCAT420(uVar15,CONCAT416(uVar15,CONCAT412
                                                  (uVar15,CONCAT48(uVar15,CONCAT44(uVar15,uVar15))))
                                                  ))));
    auVar84 = ZEXT3264(local_24e0);
    auVar93 = ZEXT3264(local_2500);
    auVar95 = ZEXT3264(local_2520);
    auVar146 = ZEXT3264(local_26c0);
    k = local_27d8;
    uVar18 = local_28a8;
    uVar21 = local_28b0;
    uVar25 = local_27e0;
    uVar26 = local_27e8;
    uVar27 = local_27f8;
    uVar28 = local_27f0;
    fVar96 = local_2540;
    fVar102 = fStack_253c;
    fVar103 = fStack_2538;
    fVar104 = fStack_2534;
    fVar105 = fStack_2530;
    fVar106 = fStack_252c;
    fVar107 = fStack_2528;
    fVar108 = local_2560;
    fVar110 = fStack_255c;
    fVar111 = fStack_2558;
    fVar112 = fStack_2554;
    fVar113 = fStack_2550;
    fVar114 = fStack_254c;
    fVar144 = fStack_2548;
    fVar147 = local_2580;
    fVar148 = fStack_257c;
    fVar149 = fStack_2578;
    fVar115 = fStack_2574;
    fVar116 = fStack_2570;
    fVar117 = fStack_256c;
    fVar118 = fStack_2568;
    fVar119 = local_25a0;
    fVar121 = fStack_259c;
    fVar122 = fStack_2598;
    fVar123 = fStack_2594;
    fVar124 = fStack_2590;
    fVar125 = fStack_258c;
    fVar126 = fStack_2588;
    fVar127 = local_25c0;
    fVar130 = fStack_25bc;
    fVar131 = fStack_25b8;
    fVar132 = fStack_25b4;
    fVar133 = fStack_25b0;
    fVar134 = fStack_25ac;
    fVar135 = fStack_25a8;
    fVar136 = local_25e0;
    fVar138 = fStack_25dc;
    fVar139 = fStack_25d8;
    fVar140 = fStack_25d4;
    fVar141 = fStack_25d0;
    fVar142 = fStack_25cc;
    fVar143 = fStack_25c8;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }